

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

int check_fixed_str(char *card,FILE *out)

{
  char *local_28;
  char *cptr;
  FILE *out_local;
  char *card_local;
  
  if (card[10] == '\'') {
    for (local_28 = card + 0xb; *local_28 != '\''; local_28 = local_28 + 1) {
      if (*local_28 == '\0') {
        sprintf(errmes,"%.8s mandatory string keyword missing closing quote character:",card);
        wrterr(out,errmes,1);
        print_fmt(out,card,0xd);
        return 0;
      }
    }
    if ((long)local_28 - (long)card < 0x13) {
      sprintf(errmes,"%.8s mandatory string keyword ends before column 20.",card);
      wrterr(out,errmes,1);
      print_fmt(out,card,0xd);
      print_fmt(out,"          ^--------^",0xd);
      card_local._4_4_ = 0;
    }
    else {
      card_local._4_4_ = 1;
    }
  }
  else {
    sprintf(errmes,"%.8s mandatory string keyword does not start in col 11.",card);
    wrterr(out,errmes,1);
    print_fmt(out,card,0xd);
    print_fmt(out,"          ^--------^",0xd);
    card_local._4_4_ = 0;
  }
  return card_local._4_4_;
}

Assistant:

int check_fixed_str(char* card, FILE *out) 
{
    char *cptr;

    /* fixed format string must have quotes in columns 11 and >= 20 */
    /* This only applys to the XTENSION and TFORMn keywords. */

    cptr = &card[10];

    if (*cptr != '\'' ) {
        sprintf(errmes,
            "%.8s mandatory string keyword does not start in col 11.",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
          print_fmt(out,"          ^--------^",13);
        return 0;
    }

    cptr++;

    while (*cptr != '\'') {

        if (*cptr == '\0') {
          sprintf(errmes,
            "%.8s mandatory string keyword missing closing quote character:",
          card);
          wrterr(out,errmes,1); 
          print_fmt(out,card,13);
          return 0;
        }
        cptr++; 
    } 

    if ((cptr - card)  < 19) {
        sprintf(errmes,
            "%.8s mandatory string keyword ends before column 20.",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
        print_fmt(out,"          ^--------^",13);

        return 0;
    } 

    return 1; 
}